

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idhash.c
# Opt level: O0

int id_map_register(nni_id_map *m)

{
  nni_id_map **__dest;
  long lVar1;
  int local_24;
  int len;
  nni_id_map **mr;
  nni_id_map *m_local;
  
  if ((m->id_flags & 5) == 1) {
    nni_mtx_lock(&id_reg_mtx);
    __dest = id_reg_map;
    if (id_reg_len <= id_reg_num) {
      if (id_reg_len < 10) {
        local_24 = 10;
      }
      else {
        local_24 = id_reg_len << 1;
      }
      __dest = (nni_id_map **)nni_zalloc((long)local_24 << 3);
      if (__dest == (nni_id_map **)0x0) {
        nni_mtx_unlock(&id_reg_mtx);
        return 2;
      }
      id_reg_len = local_24;
      if (id_reg_map != (nni_id_map **)0x0) {
        memcpy(__dest,id_reg_map,(long)id_reg_num << 3);
      }
    }
    id_reg_map = __dest;
    lVar1 = (long)id_reg_num;
    id_reg_num = id_reg_num + 1;
    id_reg_map[lVar1] = m;
    m->id_flags = m->id_flags | 4;
    nni_mtx_unlock(&id_reg_mtx);
  }
  return 0;
}

Assistant:

static int
id_map_register(nni_id_map *m)
{
	if ((m->id_flags & (NNI_ID_FLAG_STATIC | NNI_ID_FLAG_REGISTER)) !=
	    NNI_ID_FLAG_STATIC) {
		return (0);
	}
	nni_mtx_lock(&id_reg_mtx);
	if (id_reg_len <= id_reg_num) {
		nni_id_map **mr;
		int          len = id_reg_len;
		if (len < 10) {
			len = 10;
		} else {
			len *= 2;
		}
		mr = nni_zalloc(sizeof(nni_id_map *) * len);
		if (mr == NULL) {
			nni_mtx_unlock(&id_reg_mtx);
			return (NNG_ENOMEM);
		}
		id_reg_len = len;
		if (id_reg_map != NULL)
			memcpy(
			    mr, id_reg_map, id_reg_num * sizeof(nni_id_map *));
		id_reg_map = mr;
	}
	id_reg_map[id_reg_num++] = m;
	m->id_flags |= NNI_ID_FLAG_REGISTER;
	nni_mtx_unlock(&id_reg_mtx);
	return (0);
}